

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleaction.hh
# Opt level: O0

void __thiscall RuleLoadVarnode::RuleLoadVarnode(RuleLoadVarnode *this,string *g)

{
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *g_local;
  RuleLoadVarnode *this_local;
  
  local_18 = g;
  g_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"loadvarnode",&local_39);
  Rule::Rule(&this->super_Rule,g,0,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__RuleLoadVarnode_008517b8;
  return;
}

Assistant:

RuleLoadVarnode(const string &g) : Rule(g, 0, "loadvarnode") {}